

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Invoke(Result *__return_storage_ptr__,
        FunctionMocker<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *this,uint args,uchar args_1,unsigned_short args_2,unsigned_short args_3,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  unsigned_short local_20;
  unsigned_short local_1e;
  uchar local_1c;
  uint local_18;
  
  local_28 = args_4;
  local_20 = args_3;
  local_1e = args_2;
  local_1c = args_1;
  local_18 = args;
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&local_28)
  ;
  pAVar1 = DownCast_<testing::internal::ActionResultHolder<ot::commissioner::Error>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  ot::commissioner::Error::Error(__return_storage_ptr__,&(pAVar1->result_).value_);
  if (pAVar1 != (ActionResultHolder<ot::commissioner::Error> *)0x0) {
    (*(pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }